

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  U16 UVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  long lVar8;
  BYTE *pBVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  bool bVar14;
  bool local_311;
  bool local_2ed;
  int local_2e4;
  int result;
  LZ4_streamDecode_t_internal *lz4sd;
  int maxOutputSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  LZ4_streamDecode_t *LZ4_streamDecode_local;
  size_t dec64_1;
  BYTE *copyFrom_1;
  BYTE *endOfMatch_1;
  size_t copySize_1;
  uint s_3;
  uint s_2;
  BYTE *match_1;
  size_t length_1;
  uint token_1;
  int checkOffset_1;
  int safeDecode_1;
  size_t dec64table_1 [8];
  size_t dec32table_1 [8];
  BYTE *dictEnd_1;
  BYTE *lowLimit_1;
  BYTE *oexit_1;
  BYTE *cpy_1;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *iend_1;
  BYTE *ip_1;
  int local_164;
  size_t dec64;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t copySize;
  uint s_1;
  uint s;
  BYTE *match;
  size_t length;
  uint token;
  int checkOffset;
  int safeDecode;
  size_t dec64table [8];
  size_t dec32table [8];
  BYTE *dictEnd;
  BYTE *lowLimit;
  BYTE *oexit;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  int local_c;
  
  if ((char *)LZ4_streamDecode->table[2] == dest) {
    pBVar13 = (BYTE *)(LZ4_streamDecode->table[2] - LZ4_streamDecode->table[3]);
    uVar2 = LZ4_streamDecode->table[1];
    pBVar6 = (BYTE *)(source + compressedSize);
    pBVar7 = (BYTE *)(dest + maxOutputSize);
    lVar8 = LZ4_streamDecode->table[0] + uVar2;
    memcpy(dec64table + 7,&DAT_0026d0e0,0x40);
    memset(&checkOffset,0,0x40);
    dec64table[2] = 0xffffffffffffffff;
    dec64table[4] = 1;
    dec64table[5] = 2;
    dec64table[6] = 3;
    pBVar12 = (BYTE *)dest;
    iend = (BYTE *)source;
    if (maxOutputSize == 0) {
      bVar14 = false;
      if (compressedSize == 1) {
        bVar14 = *source == '\0';
      }
      local_c = -1;
      if (bVar14) {
        local_c = 0;
      }
    }
    else {
      while( true ) {
        oend = pBVar12;
        pBVar12 = iend + 1;
        bVar1 = *iend;
        match = (BYTE *)(ulong)(bVar1 >> 4);
        iend = pBVar12;
        if (match == (BYTE *)0xf) {
          match = (BYTE *)0xf;
          do {
            pBVar12 = iend + 1;
            match = match + (uint)*iend;
            local_2ed = pBVar12 < pBVar6 + -0xf && *iend == 0xff;
            iend = pBVar12;
          } while (local_2ed);
          if ((oend + (long)match < oend) || (pBVar12 + (long)match < pBVar12)) goto LAB_0025fd23;
        }
        pBVar9 = oend + (long)match;
        if ((pBVar7 + -0xc < pBVar9) || (pBVar6 + -8 < iend + (long)match)) break;
        LZ4_wildCopy(oend,iend,pBVar9);
        UVar5 = LZ4_readLE16(match + (long)iend);
        _s_1 = pBVar9 + -(long)(int)(uint)UVar5;
        iend = match + (long)iend + 2;
        if ((uVar2 < 0x10000) && (_s_1 < pBVar13 + -uVar2)) goto LAB_0025fd23;
        match = (BYTE *)(ulong)(bVar1 & 0xf);
        if (match == (BYTE *)0xf) {
          match = (BYTE *)0xf;
          do {
            if (pBVar6 + -5 < iend) goto LAB_0025fd23;
            pBVar12 = iend + 1;
            bVar1 = *iend;
            match = match + (uint)bVar1;
            iend = pBVar12;
          } while (bVar1 == 0xff);
          if (pBVar9 + (long)match < pBVar9) goto LAB_0025fd23;
        }
        pBVar12 = match + 4;
        if (_s_1 < pBVar13) {
          if (pBVar7 + -5 < pBVar9 + (long)pBVar12) goto LAB_0025fd23;
          if (pBVar13 + -(long)_s_1 < pBVar12) {
            sVar10 = (long)pBVar13 - (long)_s_1;
            memcpy(pBVar9,(void *)(lVar8 - sVar10),sVar10);
            pBVar9 = pBVar9 + sVar10;
            uVar11 = (long)pBVar12 - sVar10;
            if ((ulong)((long)pBVar9 - (long)pBVar13) < uVar11) {
              dec64 = (size_t)pBVar13;
              oend = pBVar9;
              while (pBVar12 = oend, oend < pBVar9 + uVar11) {
                *oend = *(BYTE *)dec64;
                dec64 = dec64 + 1;
                oend = oend + 1;
              }
            }
            else {
              memcpy(pBVar9,pBVar13,uVar11);
              pBVar12 = pBVar9 + uVar11;
            }
          }
          else {
            memmove(pBVar9,(void *)(lVar8 - ((long)pBVar13 - (long)_s_1)),(size_t)pBVar12);
            pBVar12 = pBVar12 + (long)pBVar9;
          }
        }
        else {
          pBVar12 = pBVar9 + (long)pBVar12;
          if ((long)pBVar9 - (long)_s_1 < 8) {
            lVar3 = *(long *)(&checkOffset + ((long)pBVar9 - (long)_s_1) * 2);
            *pBVar9 = *_s_1;
            pBVar9[1] = _s_1[1];
            pBVar9[2] = _s_1[2];
            pBVar9[3] = _s_1[3];
            sVar4 = dec64table[(long)(pBVar9 + (7 - (long)_s_1))];
            LZ4_copy4(pBVar9 + 4,_s_1 + sVar4);
            _s_1 = _s_1 + sVar4 + -lVar3;
          }
          else {
            LZ4_copy8(pBVar9,_s_1);
            _s_1 = _s_1 + 8;
          }
          oend = pBVar9 + 8;
          if (pBVar7 + -0xc < pBVar12) {
            if (pBVar7 + -5 < pBVar12) goto LAB_0025fd23;
            if (oend < pBVar7 + -8) {
              LZ4_wildCopy(oend,_s_1,pBVar7 + -8);
              _s_1 = _s_1 + (long)(pBVar7 + (-8 - (long)oend));
              oend = pBVar7 + -8;
            }
            while (oend < pBVar12) {
              *oend = *_s_1;
              _s_1 = _s_1 + 1;
              oend = oend + 1;
            }
          }
          else {
            LZ4_wildCopy(oend,_s_1,pBVar12);
          }
        }
      }
      if ((iend + (long)match == pBVar6) && (pBVar9 <= pBVar7)) {
        memcpy(oend,iend,(size_t)match);
        local_c = ((int)match + (int)oend) - (int)dest;
        goto LAB_0025fd39;
      }
LAB_0025fd23:
      local_c = -1 - ((int)iend - (int)source);
    }
LAB_0025fd39:
    local_2e4 = local_c;
    if (local_c < 1) {
      return local_c;
    }
    LZ4_streamDecode->table[3] = (long)local_c + LZ4_streamDecode->table[3];
    LZ4_streamDecode->table[2] = LZ4_streamDecode->table[2] + (long)local_c;
  }
  else {
    LZ4_streamDecode->table[1] = LZ4_streamDecode->table[3];
    LZ4_streamDecode->table[0] = LZ4_streamDecode->table[2] - LZ4_streamDecode->table[1];
    uVar2 = LZ4_streamDecode->table[1];
    pBVar6 = (BYTE *)(source + compressedSize);
    pBVar7 = (BYTE *)(dest + maxOutputSize);
    lVar8 = LZ4_streamDecode->table[0] + uVar2;
    memcpy(dec64table_1 + 7,&DAT_0026d0e0,0x40);
    memset(&checkOffset_1,0,0x40);
    dec64table_1[2] = 0xffffffffffffffff;
    dec64table_1[4] = 1;
    dec64table_1[5] = 2;
    dec64table_1[6] = 3;
    pBVar12 = (BYTE *)dest;
    iend_1 = (BYTE *)source;
    if (maxOutputSize == 0) {
      bVar14 = false;
      if (compressedSize == 1) {
        bVar14 = *source == '\0';
      }
      local_164 = -1;
      if (bVar14) {
        local_164 = 0;
      }
    }
    else {
      while( true ) {
        oend_1 = pBVar12;
        pBVar12 = iend_1 + 1;
        bVar1 = *iend_1;
        match_1 = (BYTE *)(ulong)(bVar1 >> 4);
        iend_1 = pBVar12;
        if (match_1 == (BYTE *)0xf) {
          match_1 = (BYTE *)0xf;
          do {
            pBVar12 = iend_1 + 1;
            match_1 = match_1 + (uint)*iend_1;
            local_311 = pBVar12 < pBVar6 + -0xf && *iend_1 == 0xff;
            iend_1 = pBVar12;
          } while (local_311);
          if ((oend_1 + (long)match_1 < oend_1) || (pBVar12 + (long)match_1 < pBVar12))
          goto LAB_00260930;
        }
        pBVar13 = oend_1 + (long)match_1;
        if ((pBVar7 + -0xc < pBVar13) || (pBVar6 + -8 < iend_1 + (long)match_1)) break;
        LZ4_wildCopy(oend_1,iend_1,pBVar13);
        UVar5 = LZ4_readLE16(match_1 + (long)iend_1);
        _s_3 = pBVar13 + -(long)(int)(uint)UVar5;
        iend_1 = match_1 + (long)iend_1 + 2;
        if ((uVar2 < 0x10000) && (_s_3 < dest + -uVar2)) goto LAB_00260930;
        match_1 = (BYTE *)(ulong)(bVar1 & 0xf);
        if (match_1 == (BYTE *)0xf) {
          match_1 = (BYTE *)0xf;
          do {
            if (pBVar6 + -5 < iend_1) goto LAB_00260930;
            pBVar12 = iend_1 + 1;
            bVar1 = *iend_1;
            match_1 = match_1 + (uint)bVar1;
            iend_1 = pBVar12;
          } while (bVar1 == 0xff);
          if (pBVar13 + (long)match_1 < pBVar13) goto LAB_00260930;
        }
        pBVar12 = match_1 + 4;
        if (_s_3 < dest) {
          if (pBVar7 + -5 < pBVar13 + (long)pBVar12) goto LAB_00260930;
          if (dest + -(long)_s_3 < pBVar12) {
            sVar10 = (long)dest - (long)_s_3;
            memcpy(pBVar13,(void *)(lVar8 - sVar10),sVar10);
            pBVar13 = pBVar13 + sVar10;
            uVar11 = (long)pBVar12 - sVar10;
            if ((ulong)((long)pBVar13 - (long)dest) < uVar11) {
              dec64_1 = (size_t)dest;
              oend_1 = pBVar13;
              while (pBVar12 = oend_1, oend_1 < pBVar13 + uVar11) {
                *oend_1 = *(BYTE *)dec64_1;
                dec64_1 = dec64_1 + 1;
                oend_1 = oend_1 + 1;
              }
            }
            else {
              memcpy(pBVar13,dest,uVar11);
              pBVar12 = pBVar13 + uVar11;
            }
          }
          else {
            memmove(pBVar13,(void *)(lVar8 - ((long)dest - (long)_s_3)),(size_t)pBVar12);
            pBVar12 = pBVar12 + (long)pBVar13;
          }
        }
        else {
          pBVar12 = pBVar13 + (long)pBVar12;
          if ((long)pBVar13 - (long)_s_3 < 8) {
            lVar3 = *(long *)(&checkOffset_1 + ((long)pBVar13 - (long)_s_3) * 2);
            *pBVar13 = *_s_3;
            pBVar13[1] = _s_3[1];
            pBVar13[2] = _s_3[2];
            pBVar13[3] = _s_3[3];
            sVar4 = dec64table_1[(long)(pBVar13 + (7 - (long)_s_3))];
            LZ4_copy4(pBVar13 + 4,_s_3 + sVar4);
            _s_3 = _s_3 + sVar4 + -lVar3;
          }
          else {
            LZ4_copy8(pBVar13,_s_3);
            _s_3 = _s_3 + 8;
          }
          oend_1 = pBVar13 + 8;
          if (pBVar7 + -0xc < pBVar12) {
            if (pBVar7 + -5 < pBVar12) goto LAB_00260930;
            if (oend_1 < pBVar7 + -8) {
              LZ4_wildCopy(oend_1,_s_3,pBVar7 + -8);
              _s_3 = _s_3 + (long)(pBVar7 + (-8 - (long)oend_1));
              oend_1 = pBVar7 + -8;
            }
            while (oend_1 < pBVar12) {
              *oend_1 = *_s_3;
              _s_3 = _s_3 + 1;
              oend_1 = oend_1 + 1;
            }
          }
          else {
            LZ4_wildCopy(oend_1,_s_3,pBVar12);
          }
        }
      }
      if ((iend_1 + (long)match_1 == pBVar6) && (pBVar13 <= pBVar7)) {
        memcpy(oend_1,iend_1,(size_t)match_1);
        local_164 = ((int)match_1 + (int)oend_1) - (int)dest;
        goto LAB_0026094f;
      }
LAB_00260930:
      local_164 = -1 - ((int)iend_1 - (int)source);
    }
LAB_0026094f:
    local_2e4 = local_164;
    if (local_164 < 1) {
      return local_164;
    }
    LZ4_streamDecode->table[3] = (long)local_164;
    LZ4_streamDecode->table[2] = (unsigned_long_long)(dest + local_164);
  }
  return local_2e4;
}

Assistant:

int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = (LZ4_streamDecode_t_internal*) LZ4_streamDecode;
    int result;

    if (lz4sd->prefixEnd == (BYTE*)dest)
    {
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, lz4sd->prefixEnd - lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += result;
        lz4sd->prefixEnd  += result;
    }
    else
    {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, (BYTE*)dest, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}